

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomIdentifier.cpp
# Opt level: O0

int __thiscall DIS::IntercomIdentifier::getMarshalledSize(IntercomIdentifier *this)

{
  int marshalSize;
  IntercomIdentifier *this_local;
  
  return 8;
}

Assistant:

int IntercomIdentifier::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 2;  // _siteNumber
   marshalSize = marshalSize + 2;  // _applicationNumber
   marshalSize = marshalSize + 2;  // _referenceNumber
   marshalSize = marshalSize + 2;  // _intercomNumber
    return marshalSize;
}